

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O1

int mask_intersect(uint32_t *a,uint32_t *b,int size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint in_R9D;
  bool bVar6;
  
  if (0 < size) {
    uVar3 = size + 0x1fU >> 5;
    uVar5 = 1;
    if (1 < uVar3) {
      uVar5 = (ulong)uVar3;
    }
    uVar4 = 0;
    do {
      uVar3 = b[uVar4] & a[uVar4];
      if (uVar3 != 0) {
        bVar6 = false;
        uVar2 = 0;
        if ((uVar3 & 1) == 0) {
          uVar2 = 0;
          do {
            uVar1 = uVar2;
            uVar2 = in_R9D;
            if (uVar1 == 0x1f) break;
            uVar2 = uVar1 + 1;
          } while ((uVar3 >> ((byte)uVar1 & 0x1f) & 2) == 0);
          bVar6 = 0x1e < uVar1;
        }
        in_R9D = uVar2;
        if (!bVar6) {
          return uVar2;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar5);
  }
  return -1;
}

Assistant:

int mask_intersect(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if (a[i] & b[i]) {
			int j;
			for (j = 0; j < MASK_CHUNK_SIZE; j++)
				if (a[i] & b[i] & (uint32_t)1 << j)
					return j;
		}
	return -1;
}